

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

int64_t duckdb::DatePart::EpochMillisOperator::Operation<duckdb::timestamp_t,long>
                  (timestamp_t input)

{
  timestamp_ms_t tVar1;
  
  tVar1 = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_ms_t>(input);
  return (int64_t)tVar1.super_timestamp_t.value;
}

Assistant:

int64_t DatePart::EpochMillisOperator::Operation(timestamp_t input) {
	D_ASSERT(Timestamp::IsFinite(input));
	return Cast::Operation<timestamp_t, timestamp_ms_t>(input).value;
}